

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O1

cio_error cio_random_seed_rng(cio_rng_t *rng)

{
  uint64_t uVar1;
  cio_error cVar2;
  long lVar3;
  uint64_t seeds [2];
  long local_28;
  long local_20;
  
  lVar3 = 0x5851f42d4c957f2d;
  cVar2 = cio_entropy_get_bytes(&local_28,0x10);
  if (cVar2 == CIO_SUCCESS) {
    uVar1 = local_20 * 2 + 1;
    rng->state = 0;
    rng->inc = uVar1;
    lVar3 = (local_28 + uVar1) * 0x5851f42d4c957f2d + local_20 * 2;
  }
  else {
    rng->state = 0;
    rng->inc = 1;
  }
  rng->state = lVar3 + 1;
  return cVar2;
}

Assistant:

enum cio_error cio_random_seed_rng(cio_rng_t *rng)
{
	uint64_t seeds[2];
	enum cio_error err = cio_entropy_get_bytes(&seeds, sizeof(seeds));
	if (cio_likely(err == CIO_SUCCESS)) {
		pcg_setseq_64_srandom_r(rng, seeds[0], seeds[1]);
	} else {
		pcg_setseq_64_srandom_r(rng, UINT64_C(0), UINT64_C(0));
	}

	return err;
}